

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instr.cc
# Opt level: O0

string * __thiscall
flow::Instr::formatOne(string *__return_storage_ptr__,Instr *this,string *mnemonic)

{
  bool bVar1;
  LiteralType LVar2;
  ulong uVar3;
  const_reference ppVVar4;
  long lVar5;
  ostream *poVar6;
  string *psVar7;
  Signature *pSVar8;
  reference ppCVar9;
  vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *pvVar10;
  char *pcVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string_view format_str;
  string_view format_str_00;
  ConstantArray *local_690;
  IRBuiltinFunction *local_670;
  IRBuiltinHandler *local_650;
  ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *local_628;
  ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *local_610;
  ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5> *local_5f0;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *local_5d0;
  ConstantString *local_5b0;
  long local_5a0;
  Cidr local_548;
  string local_4f8;
  reference local_4d8;
  Constant **v_3;
  const_iterator __end5_3;
  const_iterator __begin5_3;
  vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *__range5_3;
  string local_470;
  reference local_450;
  Constant **v_2;
  const_iterator __end5_2;
  const_iterator __begin5_2;
  vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *__range5_2;
  reference local_410;
  Constant **v_1;
  const_iterator __end5_1;
  const_iterator __begin5_1;
  vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *__range5_1;
  Constant **v;
  const_iterator __end5;
  const_iterator __begin5;
  vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *__range5;
  size_t i_2;
  ConstantArray *ar;
  IRBuiltinFunction *local_3a0;
  IRBuiltinFunction *bf;
  IRBuiltinHandler *local_378;
  IRBuiltinHandler *bh;
  ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *local_330;
  ConstantRegExp *re;
  string local_2d8;
  ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *local_2b8;
  ConstantCidr *cidr;
  ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5> *local_268;
  ConstantIP *ip;
  ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
  *local_240;
  ConstantString *s;
  ConstantInt *i_1;
  Value *arg;
  size_t e;
  size_t i;
  char *local_210;
  string local_208;
  basic_string_view<char> local_1e8;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream sstr;
  ostream local_198 [376];
  string *local_20;
  string *mnemonic_local;
  Instr *this_local;
  
  local_20 = mnemonic;
  mnemonic_local = (string *)this;
  this_local = (Instr *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  LVar2 = Value::type(&this->super_Value);
  if (LVar2 == Void) {
    std::operator<<(local_198,(string *)mnemonic);
  }
  else {
    Value::name_abi_cxx11_(&this->super_Value);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      fmt::v5::basic_string_view<char>::basic_string_view((basic_string_view<char> *)&i,"%{} = {}");
      psVar7 = Value::name_abi_cxx11_(&this->super_Value);
      format_str_00.size_ = (size_t)psVar7;
      format_str_00.data_ = local_210;
      fmt::v5::format<std::__cxx11::string,std::__cxx11::string>
                (&local_208,(v5 *)i,format_str_00,mnemonic,in_R9);
      std::operator<<(local_198,(string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
    }
    else {
      fmt::v5::basic_string_view<char>::basic_string_view(&local_1e8,"%??? = {}");
      format_str.size_ = (size_t)mnemonic;
      format_str.data_ = (char *)local_1e8.size_;
      fmt::v5::format<std::__cxx11::string>(&local_1d8,(v5 *)local_1e8.data_,format_str,in_R8);
      std::operator<<(local_198,(string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
  }
  e = 0;
  arg = (Value *)std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::size(&this->operands_);
  do {
    if ((Value *)e == arg) {
      std::__cxx11::stringstream::str();
      std::__cxx11::stringstream::~stringstream(local_1a8);
      return __return_storage_ptr__;
    }
    pcVar11 = " ";
    if (e != 0) {
      pcVar11 = ", ";
    }
    std::operator<<(local_198,pcVar11);
    ppVVar4 = std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::operator[]
                        (&this->operands_,e);
    i_1 = (ConstantInt *)*ppVVar4;
    if (i_1 == (ConstantInt *)0x0) {
      local_5a0 = 0;
    }
    else {
      local_5a0 = __dynamic_cast(i_1,&Value::typeinfo,&Constant::typeinfo,0);
    }
    if (local_5a0 == 0) {
LAB_001ce76e:
      poVar6 = std::operator<<(local_198,'%');
      psVar7 = Value::name_abi_cxx11_((Value *)i_1);
      std::operator<<(poVar6,(string *)psVar7);
    }
    else {
      if (i_1 == (ConstantInt *)0x0) {
        local_5b0 = (ConstantString *)0x0;
      }
      else {
        local_5b0 = (ConstantString *)
                    __dynamic_cast(i_1,&Value::typeinfo,
                                   &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0);
      }
      s = local_5b0;
      if (local_5b0 == (ConstantString *)0x0) {
        if (i_1 == (ConstantInt *)0x0) {
          local_5d0 = (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
                       *)0x0;
        }
        else {
          local_5d0 = (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
                       *)__dynamic_cast(i_1,&Value::typeinfo,
                                        &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::
                                         typeinfo,0);
        }
        local_240 = local_5d0;
        if (local_5d0 ==
            (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
             *)0x0) {
          if (i_1 == (ConstantInt *)0x0) {
            local_5f0 = (ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5> *)0x0;
          }
          else {
            local_5f0 = (ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5> *)
                        __dynamic_cast(i_1,&Value::typeinfo,
                                       &ConstantValue<flow::util::IPAddress,(flow::LiteralType)5>::
                                        typeinfo,0);
          }
          local_268 = local_5f0;
          if (local_5f0 == (ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5> *)0x0) {
            if (i_1 == (ConstantInt *)0x0) {
              local_610 = (ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *)0x0;
            }
            else {
              local_610 = (ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *)
                          __dynamic_cast(i_1,&Value::typeinfo,
                                         &ConstantValue<flow::util::Cidr,(flow::LiteralType)6>::
                                          typeinfo,0);
            }
            local_2b8 = local_610;
            if (local_610 == (ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *)0x0) {
              if (i_1 == (ConstantInt *)0x0) {
                local_628 = (ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *)0x0;
              }
              else {
                local_628 = (ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *)
                            __dynamic_cast(i_1,&Value::typeinfo,
                                           &ConstantValue<flow::util::RegExp,(flow::LiteralType)7>::
                                            typeinfo,0);
              }
              local_330 = local_628;
              if (local_628 == (ConstantValue<flow::util::RegExp,_(flow::LiteralType)7> *)0x0) {
                if (i_1 == (ConstantInt *)0x0) {
                  local_650 = (IRBuiltinHandler *)0x0;
                }
                else {
                  local_650 = (IRBuiltinHandler *)
                              __dynamic_cast(i_1,&Value::typeinfo,&IRBuiltinHandler::typeinfo,0);
                }
                local_378 = local_650;
                if (local_650 == (IRBuiltinHandler *)0x0) {
                  if (i_1 == (ConstantInt *)0x0) {
                    local_670 = (IRBuiltinFunction *)0x0;
                  }
                  else {
                    local_670 = (IRBuiltinFunction *)
                                __dynamic_cast(i_1,&Value::typeinfo,&IRBuiltinFunction::typeinfo,0);
                  }
                  local_3a0 = local_670;
                  if (local_670 == (IRBuiltinFunction *)0x0) {
                    if (i_1 == (ConstantInt *)0x0) {
                      local_690 = (ConstantArray *)0x0;
                    }
                    else {
                      local_690 = (ConstantArray *)
                                  __dynamic_cast(i_1,&Value::typeinfo,&ConstantArray::typeinfo,0);
                    }
                    if (local_690 == (ConstantArray *)0x0) goto LAB_001ce76e;
                    std::operator<<(local_198,'[');
                    __range5 = (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)0x0;
                    LVar2 = Value::type((Value *)local_690);
                    switch(LVar2) {
                    case IntArray:
                      pvVar10 = ConstantArray::get(local_690);
                      __end5 = std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::
                               begin(pvVar10);
                      v = (Constant **)
                          std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::end
                                    (pvVar10);
                      while (bVar1 = __gnu_cxx::operator!=
                                               (&__end5,(
                                                  __normal_iterator<flow::Constant_*const_*,_std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>_>
                                                  *)&v), bVar1) {
                        ppCVar9 = __gnu_cxx::
                                  __normal_iterator<flow::Constant_*const_*,_std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>_>
                                  ::operator*(&__end5);
                        if (__range5 !=
                            (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)0x0) {
                          std::operator<<(local_198,", ");
                        }
                        lVar5 = ConstantValue<long,_(flow::LiteralType)2>::get
                                          ((ConstantValue<long,_(flow::LiteralType)2> *)*ppCVar9);
                        std::ostream::operator<<(local_198,lVar5);
                        __range5 = (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)
                                   ((long)&(__range5->
                                           super__Vector_base<flow::Constant_*,_std::allocator<flow::Constant_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 1);
                        __gnu_cxx::
                        __normal_iterator<flow::Constant_*const_*,_std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>_>
                        ::operator++(&__end5);
                      }
                      break;
                    case StringArray:
                      pvVar10 = ConstantArray::get(local_690);
                      __end5_1 = std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::
                                 begin(pvVar10);
                      v_1 = (Constant **)
                            std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::end
                                      (pvVar10);
                      while (bVar1 = __gnu_cxx::operator!=
                                               (&__end5_1,
                                                (__normal_iterator<flow::Constant_*const_*,_std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>_>
                                                 *)&v_1), bVar1) {
                        local_410 = __gnu_cxx::
                                    __normal_iterator<flow::Constant_*const_*,_std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>_>
                                    ::operator*(&__end5_1);
                        if (__range5 !=
                            (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)0x0) {
                          std::operator<<(local_198,", ");
                        }
                        poVar6 = std::operator<<(local_198,'\"');
                        ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
                        ::get((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &__range5_2,
                              (ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
                               *)*local_410);
                        poVar6 = std::operator<<(poVar6,(string *)&__range5_2);
                        std::operator<<(poVar6,'\"');
                        std::__cxx11::string::~string((string *)&__range5_2);
                        __range5 = (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)
                                   ((long)&(__range5->
                                           super__Vector_base<flow::Constant_*,_std::allocator<flow::Constant_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 1);
                        __gnu_cxx::
                        __normal_iterator<flow::Constant_*const_*,_std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>_>
                        ::operator++(&__end5_1);
                      }
                      break;
                    case IPAddrArray:
                      pvVar10 = ConstantArray::get(local_690);
                      __end5_2 = std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::
                                 begin(pvVar10);
                      v_2 = (Constant **)
                            std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::end
                                      (pvVar10);
                      while (bVar1 = __gnu_cxx::operator!=
                                               (&__end5_2,
                                                (__normal_iterator<flow::Constant_*const_*,_std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>_>
                                                 *)&v_2), bVar1) {
                        local_450 = __gnu_cxx::
                                    __normal_iterator<flow::Constant_*const_*,_std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>_>
                                    ::operator*(&__end5_2);
                        if (__range5 !=
                            (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)0x0) {
                          std::operator<<(local_198,", ");
                        }
                        ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>::get
                                  ((IPAddress *)((long)&__range5_3 + 4),
                                   (ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5> *)
                                   *local_450);
                        util::IPAddress::str_abi_cxx11_
                                  (&local_470,(IPAddress *)((long)&__range5_3 + 4));
                        std::operator<<(local_198,(string *)&local_470);
                        std::__cxx11::string::~string((string *)&local_470);
                        __range5 = (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)
                                   ((long)&(__range5->
                                           super__Vector_base<flow::Constant_*,_std::allocator<flow::Constant_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 1);
                        __gnu_cxx::
                        __normal_iterator<flow::Constant_*const_*,_std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>_>
                        ::operator++(&__end5_2);
                      }
                      break;
                    case CidrArray:
                      pvVar10 = ConstantArray::get(local_690);
                      __end5_3 = std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::
                                 begin(pvVar10);
                      v_3 = (Constant **)
                            std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::end
                                      (pvVar10);
                      while (bVar1 = __gnu_cxx::operator!=
                                               (&__end5_3,
                                                (__normal_iterator<flow::Constant_*const_*,_std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>_>
                                                 *)&v_3), bVar1) {
                        local_4d8 = __gnu_cxx::
                                    __normal_iterator<flow::Constant_*const_*,_std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>_>
                                    ::operator*(&__end5_3);
                        if (__range5 !=
                            (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)0x0) {
                          std::operator<<(local_198,", ");
                        }
                        ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>::get
                                  (&local_548,
                                   (ConstantValue<flow::util::Cidr,_(flow::LiteralType)6> *)
                                   *local_4d8);
                        util::Cidr::str_abi_cxx11_(&local_4f8,&local_548);
                        std::operator<<(local_198,(string *)&local_4f8);
                        std::__cxx11::string::~string((string *)&local_4f8);
                        __range5 = (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)
                                   ((long)&(__range5->
                                           super__Vector_base<flow::Constant_*,_std::allocator<flow::Constant_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 1);
                        __gnu_cxx::
                        __normal_iterator<flow::Constant_*const_*,_std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>_>
                        ::operator++(&__end5_3);
                      }
                      break;
                    default:
                      abort();
                    }
                    std::operator<<(local_198,']');
                  }
                  else {
                    pSVar8 = IRBuiltinFunction::signature(local_670);
                    Signature::to_s_abi_cxx11_((string *)&ar,pSVar8);
                    std::operator<<(local_198,(string *)&ar);
                    std::__cxx11::string::~string((string *)&ar);
                  }
                }
                else {
                  pSVar8 = IRBuiltinHandler::signature(local_650);
                  Signature::to_s_abi_cxx11_((string *)&bf,pSVar8);
                  std::operator<<(local_198,(string *)&bf);
                  std::__cxx11::string::~string((string *)&bf);
                }
              }
              else {
                poVar6 = std::operator<<(local_198,'/');
                ConstantValue<flow::util::RegExp,_(flow::LiteralType)7>::get
                          ((RegExp *)&bh,local_330);
                psVar7 = util::RegExp::pattern_abi_cxx11_((RegExp *)&bh);
                poVar6 = std::operator<<(poVar6,(string *)psVar7);
                std::operator<<(poVar6,'/');
                util::RegExp::~RegExp((RegExp *)&bh);
              }
            }
            else {
              ConstantValue<flow::util::Cidr,_(flow::LiteralType)6>::get((Cidr *)&re,local_610);
              util::Cidr::str_abi_cxx11_(&local_2d8,(Cidr *)&re);
              std::operator<<(local_198,(string *)&local_2d8);
              std::__cxx11::string::~string((string *)&local_2d8);
            }
          }
          else {
            ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5>::get
                      ((IPAddress *)((long)&cidr + 4),local_5f0);
            pcVar11 = util::IPAddress::c_str((IPAddress *)((long)&cidr + 4));
            std::operator<<(local_198,pcVar11);
          }
        }
        else {
          poVar6 = std::operator<<(local_198,'\"');
          ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
          ::get((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ip,local_240);
          poVar6 = std::operator<<(poVar6,(string *)&ip);
          std::operator<<(poVar6,'\"');
          std::__cxx11::string::~string((string *)&ip);
        }
      }
      else {
        lVar5 = ConstantValue<long,_(flow::LiteralType)2>::get
                          ((ConstantValue<long,_(flow::LiteralType)2> *)local_5b0);
        std::ostream::operator<<(local_198,lVar5);
      }
    }
    e = e + 1;
  } while( true );
}

Assistant:

std::string Instr::formatOne(std::string mnemonic) const {
  std::stringstream sstr;

  if (type() == LiteralType::Void)
    sstr << mnemonic;
  else if (name().empty())
    sstr << fmt::format("%??? = {}", mnemonic);
  else
    sstr << fmt::format("%{} = {}", name(), mnemonic);

  for (size_t i = 0, e = operands_.size(); i != e; ++i) {
    sstr << (i ? ", " : " ");
    Value* arg = operands_[i];
    if (dynamic_cast<Constant*>(arg)) {
      if (auto i = dynamic_cast<ConstantInt*>(arg)) {
        sstr << i->get();
        continue;
      }
      if (auto s = dynamic_cast<ConstantString*>(arg)) {
        sstr << '"' << s->get() << '"';
        continue;
      }
      if (auto ip = dynamic_cast<ConstantIP*>(arg)) {
        sstr << ip->get().c_str();
        continue;
      }
      if (auto cidr = dynamic_cast<ConstantCidr*>(arg)) {
        sstr << cidr->get().str();
        continue;
      }
      if (auto re = dynamic_cast<ConstantRegExp*>(arg)) {
        sstr << '/' << re->get().pattern() << '/';
        continue;
      }
      if (auto bh = dynamic_cast<IRBuiltinHandler*>(arg)) {
        sstr << bh->signature().to_s();
        continue;
      }
      if (auto bf = dynamic_cast<IRBuiltinFunction*>(arg)) {
        sstr << bf->signature().to_s();
        continue;
      }
      if (auto ar = dynamic_cast<ConstantArray*>(arg)) {
        sstr << '[';
        size_t i = 0;
        switch (ar->type()) {
          case LiteralType::IntArray:
            for (const auto& v : ar->get()) {
              if (i) sstr << ", ";
              sstr << static_cast<ConstantInt*>(v)->get();
              ++i;
            }
            break;
          case LiteralType::StringArray:
            for (const auto& v : ar->get()) {
              if (i) sstr << ", ";
              sstr << '"' << static_cast<ConstantString*>(v)->get() << '"';
              ++i;
            }
            break;
          case LiteralType::IPAddrArray:
            for (const auto& v : ar->get()) {
              if (i) sstr << ", ";
              sstr << static_cast<ConstantIP*>(v)->get().str();
              ++i;
            }
            break;
          case LiteralType::CidrArray:
            for (const auto& v : ar->get()) {
              if (i) sstr << ", ";
              sstr << static_cast<ConstantCidr*>(v)->get().str();
              ++i;
            }
            break;
          default:
            abort();
        }
        sstr << ']';
        continue;
      }
    }
    sstr << '%' << arg->name();
  }

  // XXX sometimes u're interested in the name of the instr, even though it
  // doesn't yield a result value on the stack
  // if (type() == LiteralType::Void) {
  //   sstr << "\t; (%" << name() << ")";
  // }

  return sstr.str();
}